

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

int Wln_RetPropDelay_rec(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  Wln_Ntk_t *p_00;
  long lVar5;
  
  piVar3 = Vec_IntEntryP(&p->vPathDelays,iObj);
  iVar2 = *piVar3;
  if (iVar2 < 0) {
    *piVar3 = 0;
    for (lVar5 = 0; lVar5 < p->pNtk->vFanins[iObj].nSize; lVar5 = lVar5 + 1) {
      piVar4 = Wln_RetFanins(p,iObj);
      iVar2 = piVar4[lVar5 * 2];
      piVar4 = Wln_RetFanins(p,iObj);
      if ((long)iVar2 != 0) {
        p_00 = p->pNtk;
        if (p_00->vFanins[iVar2].nSize == 0) {
          iVar1 = Wln_ObjIsCi(p_00,iVar2);
          if (iVar1 == 0) goto LAB_0032136e;
          p_00 = p->pNtk;
        }
        iVar1 = Wln_ObjIsFf(p_00,iObj);
        if ((lVar5 == 0) || (iVar1 == 0)) {
          iVar1 = *piVar3;
          if (piVar4[lVar5 * 2 + 1] == 0) {
            iVar2 = Wln_RetPropDelay_rec(p,iVar2);
          }
          else {
            iVar2 = 0;
          }
          if (iVar2 < iVar1) {
            iVar2 = iVar1;
          }
          *piVar3 = iVar2;
        }
      }
LAB_0032136e:
    }
    iVar2 = Vec_IntEntry(&p->vNodeDelays,iObj);
    iVar2 = iVar2 + *piVar3;
    *piVar3 = iVar2;
  }
  return iVar2;
}

Assistant:

int Wln_RetPropDelay_rec( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, * pDelay = Vec_IntEntryP( &p->vPathDelays, iObj );
    if ( *pDelay >= 0 )
        return *pDelay;
    *pDelay = 0;
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        if ( Wln_ObjIsFf(p->pNtk, iObj) && k > 0 )
            continue;
        if ( pLink[0] )
            *pDelay = Abc_MaxInt(*pDelay, 0);
        else
            *pDelay = Abc_MaxInt(*pDelay, Wln_RetPropDelay_rec(p, iFanin));
    }
    *pDelay += Vec_IntEntry( &p->vNodeDelays, iObj );
    return *pDelay;
}